

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O2

exr_result_t
exr_compress_buffer(exr_const_context_t_conflict ctxt,int level,void *in,size_t in_bytes,void *out,
                   size_t out_bytes_avail,size_t *actual_out)

{
  long lVar1;
  size_t sVar2;
  exr_result_t eVar3;
  code *pcVar4;
  code *pcVar5;
  int level_local;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    pcVar4 = internal_exr_free;
    pcVar5 = internal_exr_alloc;
  }
  else {
    pcVar5 = ctxt->alloc_fn;
    pcVar4 = ctxt->free_fn;
  }
  level_local = level;
  libdeflate_set_memory_allocator(pcVar5,pcVar4);
  if (level < 0) {
    exr_get_default_zip_compression_level(&level_local);
    level = level_local;
    if (level_local < 0) {
      level_local = 4;
      level = 4;
    }
  }
  lVar1 = libdeflate_alloc_compressor(level);
  eVar3 = 1;
  if (lVar1 != 0) {
    sVar2 = libdeflate_zlib_compress(lVar1,in,in_bytes,out,out_bytes_avail);
    libdeflate_free_compressor(lVar1);
    if (sVar2 != 0) {
      eVar3 = 0;
      if (actual_out != (size_t *)0x0) {
        *actual_out = sVar2;
      }
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_compress_buffer (
    exr_const_context_t ctxt,
    int                 level,
    const void*         in,
    size_t              in_bytes,
    void*               out,
    size_t              out_bytes_avail,
    size_t*             actual_out)
{
    struct libdeflate_compressor* comp;

#ifdef EXR_USE_CONFIG_DEFLATE_STRUCT
    struct libdeflate_options opt = {
        .sizeof_options = sizeof (struct libdeflate_options),
        .malloc_func    = ctxt ? ctxt->alloc_fn : internal_exr_alloc,
        .free_func      = ctxt ? ctxt->free_fn : internal_exr_free};

#else
    libdeflate_set_memory_allocator (
        ctxt ? ctxt->alloc_fn : internal_exr_alloc,
        ctxt ? ctxt->free_fn : internal_exr_free);
#endif

    if (level < 0)
    {
        exr_get_default_zip_compression_level (&level);
        /* truly unset anywhere */
        if (level < 0) level = EXR_DEFAULT_ZLIB_COMPRESS_LEVEL;
    }

#ifdef EXR_USE_CONFIG_DEFLATE_STRUCT
    comp = libdeflate_alloc_compressor_ex (level, &opt);
#else
    comp = libdeflate_alloc_compressor (level);
#endif
    if (comp)
    {
        size_t outsz;
        outsz =
            libdeflate_zlib_compress (comp, in, in_bytes, out, out_bytes_avail);

        libdeflate_free_compressor (comp);

        if (outsz != 0)
        {
            if (actual_out) *actual_out = outsz;
            return EXR_ERR_SUCCESS;
        }
        return EXR_ERR_OUT_OF_MEMORY;
    }
    return EXR_ERR_OUT_OF_MEMORY;
}